

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.h
# Opt level: O0

void __thiscall
Eigen::internal::
BlockImpl_dense<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_-1,_true>,_2,_-1,_false>,_1,_-1,_false,_true>
::BlockImpl_dense(BlockImpl_dense<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_2,__1,_false>,_1,__1,_false,_true>
                  *this,Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_2,__1,_false>
                        *xpr,Index i)

{
  Scalar *ptr;
  Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_2,__1,_false> *pBVar1;
  Index in_RDX;
  EVP_PKEY_CTX *in_RSI;
  BlockImpl_dense<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_2,__1,_false>,_1,__1,_false,_true>
  *in_RDI;
  MapBase<Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_2,__1,_false>,_1,__1,_false>,_0>
  *unaff_retaddr;
  Index in_stack_00000008;
  BlockImpl_dense<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_2,__1,_false>,_1,__1,_false,_true>
  *dataPtr;
  
  dataPtr = in_RDI;
  ptr = MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_-1,_true>,_2,_-1,_false>,_0>
        ::coeffRef((MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_2,__1,_false>,_0>
                    *)i,in_stack_00000008,(Index)unaff_retaddr);
  pBVar1 = (Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_2,__1,_false> *)
           const_cast_ptr<double>(ptr);
  MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_-1,_true>,_2,_-1,_false>,_0>
  ::cols((MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_2,__1,_false>,_0>
          *)0x2f2856);
  MapBase<Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_-1,_true>,_2,_-1,_false>,_1,_-1,_false>,_0>
  ::MapBase(unaff_retaddr,(PointerType)dataPtr,(Index)in_RSI,in_RDX);
  Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_-1,_true>,_2,_-1,_false>::Block
            ((Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_2,__1,_false> *
             )in_RDI,pBVar1);
  init(in_RDI,in_RSI);
  return;
}

Assistant:

inline BlockImpl_dense(XprType& xpr, Index i)
      : Base(internal::const_cast_ptr(&xpr.coeffRef(
              (BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) ? i : 0,
              (BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) ? i : 0)),
             BlockRows==1 ? 1 : xpr.rows(),
             BlockCols==1 ? 1 : xpr.cols()),
        m_xpr(xpr)
    {
      init();
    }